

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

DObject * __thiscall PClass::CreateNew(PClass *this)

{
  DObject *__s;
  ulong __n;
  
  __s = (DObject *)
        M_Malloc_Dbg((ulong)*(uint *)&(this->super_PStruct).super_PNamedType.super_PCompoundType.
                                      super_PType.super_DObject.field_0x24,
                     "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                     ,0xc3a);
  if (__s != (DObject *)0x0) {
    __n = (ulong)*(uint *)&(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                           super_DObject.field_0x24;
    if (this->Defaults == (BYTE *)0x0) {
      memset(__s,0,__n);
    }
    else {
      memcpy(__s,this->Defaults,__n);
    }
    (*this->ConstructNative)(__s);
    __s->Class = this;
    if (this->Defaults != (BYTE *)0x0) {
      InitializeSpecials(this,__s);
    }
    return __s;
  }
  __assert_fail("mem != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0xc3b,"DObject *PClass::CreateNew() const");
}

Assistant:

DObject *PClass::CreateNew() const
{
	BYTE *mem = (BYTE *)M_Malloc (Size);
	assert (mem != NULL);

	// Set this object's defaults before constructing it.
	if (Defaults != NULL)
		memcpy (mem, Defaults, Size);
	else
		memset (mem, 0, Size);

	ConstructNative (mem);
	((DObject *)mem)->SetClass (const_cast<PClass *>(this));
	if (Defaults != NULL)
	{
		InitializeSpecials(mem);
	}
	return (DObject *)mem;
}